

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,true,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  sel_t sVar11;
  int64_t *piVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (count + 0x3f < 0x40) {
    lVar8 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar8 = 0;
    uVar6 = 0;
    uVar14 = 0;
    do {
      uVar10 = uVar6;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar18 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar18 = count;
        }
LAB_0145c627:
        if (uVar6 < uVar18) {
          psVar3 = sel->sel_vector;
          iVar1 = rdata->months;
          iVar15 = rdata->days;
          lVar5 = rdata->micros;
          psVar4 = false_sel->sel_vector;
          lVar13 = lVar5 / 86400000000 + (long)iVar15;
          piVar12 = &ldata[uVar6].micros;
          do {
            uVar10 = uVar6;
            if (psVar3 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar3[uVar6];
            }
            lVar7 = *piVar12;
            if ((*(int32_t *)((long)piVar12 + -4) == iVar15 &&
                ((interval_t *)(piVar12 + -1))->months == iVar1) && lVar7 == lVar5) {
              uVar9 = 0;
            }
            else {
              lVar16 = (long)*(int32_t *)((long)piVar12 + -4) + lVar7 / 86400000000;
              uVar9 = 1;
              if (((long)((interval_t *)(piVar12 + -1))->months + lVar16 / 0x1e ==
                   lVar13 / 0x1e + (long)iVar1) && (lVar16 % 0x1e == lVar13 % 0x1e)) {
                uVar9 = (ulong)(lVar7 % 86400000000 != lVar5 % 86400000000);
              }
            }
            psVar4[lVar8] = (sel_t)uVar10;
            lVar8 = uVar9 + lVar8;
            uVar6 = uVar6 + 1;
            piVar12 = piVar12 + 2;
            uVar10 = uVar18;
          } while (uVar18 != uVar6);
        }
      }
      else {
        uVar9 = puVar2[uVar14];
        uVar18 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar18 = count;
        }
        if (uVar9 == 0xffffffffffffffff) goto LAB_0145c627;
        if (uVar9 == 0) {
          uVar10 = uVar18;
          if (uVar6 < uVar18) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar11 = (sel_t)uVar6;
              if (psVar3 != (sel_t *)0x0) {
                sVar11 = psVar3[uVar6];
              }
              psVar4[lVar8] = sVar11;
              lVar8 = lVar8 + 1;
              uVar6 = uVar6 + 1;
            } while (uVar18 != uVar6);
          }
        }
        else if (uVar6 < uVar18) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          piVar12 = &ldata[uVar6].micros;
          uVar17 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar11 = (int)uVar6 + (int)uVar17;
            }
            else {
              sVar11 = psVar3[uVar6 + uVar17];
            }
            uVar10 = 1;
            if ((uVar9 >> (uVar17 & 0x3f) & 1) != 0) {
              iVar1 = *(int32_t *)((long)piVar12 + -4);
              lVar5 = *piVar12;
              lVar13 = rdata->micros;
              iVar15 = rdata->days;
              if ((rdata->days == iVar1 && rdata->months == ((interval_t *)(piVar12 + -1))->months)
                 && (iVar15 = iVar1, lVar5 == lVar13)) {
                uVar10 = 0;
              }
              else {
                lVar7 = (long)iVar1 + lVar5 / 86400000000;
                lVar16 = (long)iVar15 + lVar13 / 86400000000;
                if (((long)((interval_t *)(piVar12 + -1))->months + lVar7 / 0x1e ==
                     (long)rdata->months + lVar16 / 0x1e) && (lVar7 % 0x1e == lVar16 % 0x1e)) {
                  uVar10 = (ulong)(lVar5 % 86400000000 != lVar13 % 86400000000);
                }
              }
            }
            psVar4[lVar8] = sVar11;
            lVar8 = uVar10 + lVar8;
            uVar17 = uVar17 + 1;
            piVar12 = piVar12 + 2;
            uVar10 = uVar18;
          } while (uVar18 - uVar6 != uVar17);
        }
      }
      uVar6 = uVar10;
      uVar14 = uVar14 + 1;
    } while (uVar14 != count + 0x3f >> 6);
  }
  return count - lVar8;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}